

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
::get_content(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
             Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
             *this,int columnLength)

{
  ulong in_RAX;
  long lVar1;
  _Base_ptr p_Var2;
  reference rVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (columnLength < 0) {
    if ((this->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      return __return_storage_ptr__;
    }
    lVar1 = std::_Rb_tree_decrement(&(this->column_)._M_t._M_impl.super__Rb_tree_header._M_header);
    columnLength = *(int *)(*(long *)(lVar1 + 0x20) + 4) + 1;
  }
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(long)columnLength,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  p_Var2 = (this->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var2 != &(this->column_)._M_t._M_impl.super__Rb_tree_header &&
         (*(uint *)(*(long *)(p_Var2 + 1) + 4) < (uint)columnLength))) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (__return_storage_ptr__,(ulong)*(uint *)(*(long *)(p_Var2 + 1) + 4));
    *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Set_column<Master_matrix>::Field_element> Set_column<Master_matrix>::get_content(
    int columnLength) const
{
  if (columnLength < 0 && column_.size() > 0)
    columnLength = (*column_.rbegin())->get_row_index() + 1;
  else if (columnLength < 0)
    return std::vector<Field_element>();

  std::vector<Field_element> container(columnLength, 0);
  for (auto it = column_.begin(); it != column_.end() && (*it)->get_row_index() < static_cast<ID_index>(columnLength);
       ++it) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      container[(*it)->get_row_index()] = 1;
    } else {
      container[(*it)->get_row_index()] = (*it)->get_element();
    }
  }
  return container;
}